

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void deleted_doc_stat_test(void)

{
  size_t sVar1;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  fdb_config fconfig;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc *doc;
  fdb_doc _doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *handle;
  void *in_stack_fffffffffffffac0;
  size_t in_stack_fffffffffffffac8;
  void *in_stack_fffffffffffffad0;
  fdb_doc **in_stack_fffffffffffffad8;
  undefined1 local_520 [16];
  fdb_file_info *in_stack_fffffffffffffaf0;
  fdb_file_handle *in_stack_fffffffffffffaf8;
  fdb_doc *in_stack_fffffffffffffb10;
  fdb_kvs_handle *in_stack_fffffffffffffb18;
  char local_428 [136];
  fdb_kvs_config *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  fdb_kvs_handle **in_stack_fffffffffffffc70;
  fdb_file_handle *in_stack_fffffffffffffc78;
  fdb_config *in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  fdb_file_handle **in_stack_fffffffffffffce8;
  long local_200;
  undefined1 local_1c8 [28];
  undefined4 local_1ac;
  fdb_status local_cc;
  fdb_doc *local_c8;
  fdb_doc *local_c0;
  fdb_doc local_b8;
  fdb_kvs_handle *local_68;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_c0 = &local_b8;
  local_54 = system("rm -rf  dummy* > errorlog.txt");
  memset(local_c0,0,0x50);
  local_c0->key = &stack0xfffffffffffffcd8;
  local_c0->body = local_428;
  local_c0->seqnum = 0xffffffffffffffff;
  fdb_get_default_config();
  memcpy(local_1c8,local_520,0xf8);
  local_1ac = 0;
  fdb_get_default_kvs_config();
  local_cc = fdb_open(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8)
  ;
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x28c);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x28c,"void deleted_doc_stat_test()");
    }
  }
  local_cc = fdb_kvs_open(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                          in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x28e);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x28e,"void deleted_doc_stat_test()");
    }
  }
  sprintf(&stack0xfffffffffffffcd8,"K");
  sprintf(local_428,"body");
  sVar1 = strlen(&stack0xfffffffffffffcd8);
  local_c0->keylen = sVar1 + 1;
  sVar1 = strlen(local_428);
  local_c0->bodylen = sVar1 + 1;
  local_cc = fdb_set(local_68,local_c0);
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x295);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x295,"void deleted_doc_stat_test()");
    }
  }
  local_cc = fdb_del(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x299);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x299,"void deleted_doc_stat_test()");
    }
  }
  handle = (fdb_kvs_handle *)0x0;
  fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 in_stack_fffffffffffffac0,0,(void *)0x109685,(size_t)in_stack_fffffffffffffaf0);
  local_cc = fdb_get(local_68,local_c8);
  if (local_cc != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x29e);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x29e,"void deleted_doc_stat_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x109713);
  fdb_get_file_info(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  if (local_200 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2a3);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_200 != 0) {
      __assert_fail("info.doc_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2a3,"void deleted_doc_stat_test()");
    }
  }
  local_cc = fdb_commit((fdb_file_handle *)handle,'\0');
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2a6);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2a6,"void deleted_doc_stat_test()");
    }
  }
  fdb_get_file_info(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  if (local_200 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2a9);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_200 != 0) {
      __assert_fail("info.doc_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2a9,"void deleted_doc_stat_test()");
    }
  }
  local_cc = fdb_kvs_close(handle);
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2ac);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2ac,"void deleted_doc_stat_test()");
    }
  }
  local_cc = fdb_close((fdb_file_handle *)handle);
  if (local_cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2ae);
    deleted_doc_stat_test::__test_pass = 0;
    if (local_cc != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2ae,"void deleted_doc_stat_test()");
    }
  }
  fdb_shutdown();
  memleak_end();
  if (deleted_doc_stat_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","deleted doc stat test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","deleted doc stat test");
  }
  return;
}

Assistant:

void deleted_doc_stat_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc _doc;
    fdb_doc *doc = &_doc;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_file_info info;
    fdb_kvs_config kvs_config;
    char keybuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    memset(doc, 0, sizeof(fdb_doc));
    doc->key = &keybuf[0];
    doc->body = &bodybuf[0];
    doc->seqnum = SEQNUM_NOT_USED;

    // open dbfile
    fconfig = fdb_get_default_config();
    fconfig.purging_interval = 0;
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "main", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "K"); // This is necessary to set keysize to 2 bytes so
    sprintf(bodybuf, "body"); // it matches KV_header doc's keysize of 10
    doc->keylen = strlen(keybuf) + 1; // in multi-kv mode and hits MB-16491
    doc->bodylen = strlen(bodybuf) + 1;
    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Delete the doc
    status = fdb_del(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Fetch the doc back
    fdb_doc_create(&rdoc, doc->key, doc->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    fdb_doc_free(rdoc);

    // check the file info
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 0);

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check the file info again after commit..
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 0);

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("deleted doc stat test");
}